

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O0

void beltHashStart(void *state)

{
  u32 *in_RDI;
  belt_hash_st *st;
  u32 *src;
  
  in_RDI[0] = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  src = in_RDI + 0xc;
  beltH();
  u32From(in_RDI,src,0x14a63b);
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  return;
}

Assistant:

void beltHashStart(void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	ASSERT(memIsValid(state, beltHash_keep()));
	// len || s <- 0
	beltBlockSetZero(st->ls);
	beltBlockSetZero(st->ls + 4);
	// h <- B194...0D
	u32From(st->h, beltH(), 32);
	// нет накопленнных данных
	st->filled = 0;
}